

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureBorderClampTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_1::TextureBorderClampFormatCase::init
          (TextureBorderClampFormatCase *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  Texture2D *this_00;
  Texture2D *this_01;
  TextureFormat *baseFormat;
  size_type sVar2;
  float fVar3;
  Vector<float,_4> local_1e8;
  Vector<float,_4> local_1d8;
  reference local_1c8;
  IterationConfig *iteration_2;
  int ndx;
  anon_union_16_3_1194ccdc_for_v local_1a8;
  Vector<float,_2> local_198;
  Vector<float,_2> local_190;
  undefined1 local_188 [8];
  IterationConfig iteration_1;
  anon_union_16_3_1194ccdc_for_v local_fc;
  Vector<float,_2> local_ec [2];
  Vector<float,_2> local_d8;
  undefined1 local_d0 [8];
  IterationConfig iteration;
  TextureFormatInfo texFormatInfo;
  TextureFormat texFormat;
  TextureBorderClampFormatCase *this_local;
  
  TextureBorderClampTest::init(&this->super_TextureBorderClampTest,ctx);
  this_00 = TextureBorderClampTest::getTexture(&this->super_TextureBorderClampTest);
  this_01 = glu::Texture2D::getRefTexture(this_00);
  baseFormat = tcu::TextureLevelPyramid::getFormat(&this_01->super_TextureLevelPyramid);
  texFormatInfo.lookupBias.m_data._8_8_ =
       tcu::getEffectiveDepthStencilTextureFormat
                 (baseFormat,(this->super_TextureBorderClampTest).m_sampleMode);
  tcu::getTextureFormatInfo
            ((TextureFormatInfo *)&iteration.compareMode,
             (TextureFormat *)(texFormatInfo.lookupBias.m_data + 2));
  TextureBorderClampTest::IterationConfig::IterationConfig((IterationConfig *)local_d0);
  tcu::Vector<float,_2>::Vector(&local_d8,-1.5,-3.0);
  local_d0._0_4_ = local_d8.m_data[0];
  local_d0._4_4_ = local_d8.m_data[1];
  tcu::Vector<float,_2>::Vector(local_ec,1.5,2.5);
  iteration.p0.m_data[0] = local_ec[0].m_data[0];
  iteration.p0.m_data[1] = local_ec[0].m_data[1];
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&iteration_1.compareRef,0.3,0.7,0.2,0.5);
  local_fc = (anon_union_16_3_1194ccdc_for_v)
             mapToFormatColorRepresentable
                       ((TextureFormat *)(texFormatInfo.lookupBias.m_data + 2),
                        (Vec4 *)&iteration_1.compareRef);
  rr::GenericVec4::operator=((GenericVec4 *)&iteration.p1,(GenericVec4 *)&local_fc);
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig>_>
  ::push_back(&this->m_iterations,(value_type *)local_d0);
  TextureBorderClampTest::IterationConfig::~IterationConfig((IterationConfig *)local_d0);
  TextureBorderClampTest::IterationConfig::IterationConfig((IterationConfig *)local_188);
  tcu::Vector<float,_2>::Vector(&local_190,-0.5,0.75);
  local_188._0_4_ = local_190.m_data[0];
  local_188._4_4_ = local_190.m_data[1];
  tcu::Vector<float,_2>::Vector(&local_198,0.25,1.25);
  iteration_1.p0.m_data[0] = local_198.m_data[0];
  iteration_1.p0.m_data[1] = local_198.m_data[1];
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&stack0xfffffffffffffe48,0.9,0.2,0.4,0.6);
  local_1a8 = (anon_union_16_3_1194ccdc_for_v)
              mapToFormatColorRepresentable
                        ((TextureFormat *)(texFormatInfo.lookupBias.m_data + 2),
                         (Vec4 *)&stack0xfffffffffffffe48);
  rr::GenericVec4::operator=((GenericVec4 *)&iteration_1.p1,(GenericVec4 *)&local_1a8);
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig>_>
  ::push_back(&this->m_iterations,(value_type *)local_188);
  TextureBorderClampTest::IterationConfig::~IterationConfig((IterationConfig *)local_188);
  iteration_2._4_4_ = 0;
  while( true ) {
    iVar1 = iteration_2._4_4_;
    sVar2 = std::
            vector<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig>_>
            ::size(&this->m_iterations);
    if ((int)sVar2 <= iVar1) break;
    local_1c8 = std::
                vector<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig>_>
                ::operator[](&this->m_iterations,(long)iteration_2._4_4_);
    if ((this->super_TextureBorderClampTest).m_samplingFunction == SAMPLE_GATHER) {
      fVar3 = tcu::Vector<float,_4>::x((Vector<float,_4> *)(texFormatInfo.valueMax.m_data + 2));
      tcu::Vector<float,_4>::Vector(&local_1d8,fVar3);
      *(undefined8 *)(local_1c8->lookupScale).m_data = local_1d8.m_data._0_8_;
      *(undefined8 *)((local_1c8->lookupScale).m_data + 2) = local_1d8.m_data._8_8_;
      fVar3 = tcu::Vector<float,_4>::x((Vector<float,_4> *)(texFormatInfo.lookupScale.m_data + 2));
      tcu::Vector<float,_4>::Vector(&local_1e8,fVar3);
      *(undefined8 *)(local_1c8->lookupBias).m_data = local_1e8.m_data._0_8_;
      *(undefined8 *)((local_1c8->lookupBias).m_data + 2) = local_1e8.m_data._8_8_;
    }
    else {
      *(undefined8 *)(local_1c8->lookupScale).m_data = texFormatInfo.valueMax.m_data._8_8_;
      *(undefined8 *)((local_1c8->lookupScale).m_data + 2) = texFormatInfo.lookupScale.m_data._0_8_;
      *(undefined8 *)(local_1c8->lookupBias).m_data = texFormatInfo.lookupScale.m_data._8_8_;
      *(undefined8 *)((local_1c8->lookupBias).m_data + 2) = texFormatInfo.lookupBias.m_data._0_8_;
    }
    local_1c8->minFilter = this->m_filter;
    local_1c8->magFilter = this->m_filter;
    local_1c8->sWrapMode = 0x812d;
    local_1c8->tWrapMode = 0x812d;
    local_1c8->compareMode = 0;
    local_1c8->compareRef = 0.0;
    iteration_2._4_4_ = iteration_2._4_4_ + 1;
  }
  return iVar1;
}

Assistant:

void TextureBorderClampFormatCase::init (void)
{
	TextureBorderClampTest::init();

	// \note TextureBorderClampTest::init() creates texture
	const tcu::TextureFormat		texFormat		= tcu::getEffectiveDepthStencilTextureFormat(getTexture()->getRefTexture().getFormat(), m_sampleMode);
	const tcu::TextureFormatInfo	texFormatInfo	= tcu::getTextureFormatInfo(texFormat);

	// iterations

	{
		IterationConfig iteration;
		iteration.p0			= tcu::Vec2(-1.5f, -3.0f);
		iteration.p1			= tcu::Vec2( 1.5f,  2.5f);
		iteration.borderColor	= mapToFormatColorRepresentable(texFormat, tcu::Vec4(0.3f, 0.7f, 0.2f, 0.5f));
		m_iterations.push_back(iteration);
	}
	{
		IterationConfig iteration;
		iteration.p0			= tcu::Vec2(-0.5f, 0.75f);
		iteration.p1			= tcu::Vec2(0.25f, 1.25f);
		iteration.borderColor	= mapToFormatColorRepresentable(texFormat, tcu::Vec4(0.9f, 0.2f, 0.4f, 0.6f));
		m_iterations.push_back(iteration);
	}

	// common parameters
	for (int ndx = 0; ndx < (int)m_iterations.size(); ++ndx)
	{
		IterationConfig& iteration = m_iterations[ndx];

		if (m_samplingFunction == SAMPLE_GATHER)
		{
			iteration.lookupScale	= tcu::Vec4(texFormatInfo.lookupScale.x());
			iteration.lookupBias	= tcu::Vec4(texFormatInfo.lookupBias.x());
		}
		else
		{
			iteration.lookupScale	= texFormatInfo.lookupScale;
			iteration.lookupBias	= texFormatInfo.lookupBias;
		}

		iteration.minFilter		= m_filter;
		iteration.magFilter		= m_filter;
		iteration.sWrapMode		= GL_CLAMP_TO_BORDER;
		iteration.tWrapMode		= GL_CLAMP_TO_BORDER;
		iteration.compareMode	= GL_NONE;
		iteration.compareRef	= 0.0f;
	}
}